

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

GLuint __thiscall
gl4cts::GPUShaderFP64Test10::functionObject::getArgumentStride(functionObject *this)

{
  GLuint GVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLuint argument;
  
  GVar1 = (*this->_vptr_functionObject[3])();
  if (GVar1 == 0) {
    GVar3 = 0;
  }
  else {
    argument = 0;
    GVar3 = 0;
    do {
      GVar2 = getArgumentStride(this,argument);
      GVar3 = GVar3 + GVar2;
      argument = argument + 1;
    } while (GVar1 != argument);
  }
  return GVar3;
}

Assistant:

glw::GLuint GPUShaderFP64Test10::functionObject::getArgumentStride() const
{
	const glw::GLuint n_args = getArgumentCount();
	glw::GLuint		  result = 0;

	for (glw::GLuint i = 0; i < n_args; ++i)
	{
		result += getArgumentStride(i);
	}

	return result;
}